

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int LoadEXRWithLayer(float **out_rgba,int *width,int *height,char *filename,char *layername,
                    char **err)

{
  long *plVar1;
  size_t sVar2;
  uchar *puVar3;
  uchar **ppuVar4;
  uchar *puVar5;
  uchar *puVar6;
  pointer pLVar7;
  pointer pLVar8;
  int iVar9;
  undefined1 auVar10 [8];
  int *piVar11;
  int iVar12;
  ostream *poVar13;
  char *pcVar14;
  size_t sVar15;
  long lVar16;
  float *pfVar17;
  ulong uVar18;
  long lVar19;
  size_t pixel_size_1;
  size_type *psVar20;
  ulong uVar21;
  size_t jj;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  pointer pLVar23;
  ulong uVar24;
  long lVar25;
  char *pcVar26;
  long lVar27;
  EXRTile *pEVar28;
  size_t jj_1;
  long lVar29;
  int iVar30;
  ulong uVar31;
  size_t pixel_size;
  int *piVar32;
  float *pfVar33;
  float fVar34;
  vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> channels;
  string ch_name;
  EXRImage exr_image;
  EXRVersion exr_version;
  stringstream ss;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  layer_names;
  EXRHeader exr_header;
  int local_480;
  long local_460;
  int local_458;
  int local_448;
  int local_440;
  vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> local_438;
  long local_420;
  long *local_418;
  ulong local_410;
  long local_408 [2];
  EXRImage local_3f8;
  long *local_3c8;
  long local_3c0;
  long local_3b8 [2];
  EXRTile *local_3a8;
  long local_3a0;
  long *local_398;
  long local_390;
  long local_388 [2];
  EXRVersion local_374;
  undefined1 local_360 [8];
  _Alloc_hider local_358;
  size_type local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348 [6];
  ios_base local_2e0 [264];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  int *local_1b8 [2];
  long local_1a8 [5];
  int local_180;
  int local_17c;
  int local_178;
  EXRChannelInfo *local_150;
  int *local_148;
  int local_140;
  int *local_138;
  
  if (out_rgba == (float **)0x0) {
    piVar32 = (int *)((long)&((EXRHeader *)local_1b8)->data_window + 8);
    local_1b8[0] = piVar32;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,"Invalid argument for LoadEXR()","");
    piVar11 = local_1b8[0];
    if (err != (char **)0x0) {
      pcVar14 = strdup((char *)local_1b8[0]);
      *err = pcVar14;
    }
    if (piVar11 != piVar32) {
      operator_delete(piVar11,local_1a8[0] + 1);
    }
    return -3;
  }
  memset((EXRHeader *)local_1b8,0,0x188);
  local_3f8.tiles = (EXRTile *)0x0;
  local_3f8.next_level = (TEXRImage *)0x0;
  local_3f8.level_x = 0;
  local_3f8.level_y = 0;
  local_3f8.images = (uchar **)0x0;
  local_3f8.width = 0;
  local_3f8.height = 0;
  local_3f8.num_channels = 0;
  local_3f8.num_tiles = 0;
  iVar12 = ParseEXRVersionFromFile(&local_374,filename);
  if (iVar12 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_360);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_350,
               "Failed to open EXR file or read version info from EXR file. code(",0x41);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&local_350,iVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,")",1);
    std::__cxx11::stringbuf::str();
    if (err != (char **)0x0) {
      pcVar14 = strdup((char *)local_418);
      *err = pcVar14;
    }
    if (local_418 != local_408) {
      operator_delete(local_418,local_408[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_360);
    std::ios_base::~ios_base(local_2e0);
    return iVar12;
  }
  if (local_374.non_image != 0 || local_374.multipart != 0) {
    local_360 = (undefined1  [8])&local_350;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_360,
               "Loading multipart or DeepImage is not supported  in LoadEXR() API","");
    auVar10 = local_360;
    if (err != (char **)0x0) {
      pcVar14 = strdup((char *)local_360);
      *err = pcVar14;
    }
    if (auVar10 != (undefined1  [8])&local_350) {
      operator_delete((void *)auVar10,local_350 + 1);
    }
    return -4;
  }
  iVar12 = ParseEXRHeaderFromFile((EXRHeader *)local_1b8,&local_374,filename,err);
  if (iVar12 != 0) {
LAB_005a7ab3:
    FreeEXRHeader((EXRHeader *)local_1b8);
    return iVar12;
  }
  if (0 < local_140) {
    lVar25 = 0;
    do {
      if (local_148[lVar25] == 1) {
        local_138[lVar25] = 2;
      }
      lVar25 = lVar25 + 1;
    } while (lVar25 < local_140);
  }
  iVar12 = LoadEXRImageFromFile(&local_3f8,(EXRHeader *)local_1b8,filename,err);
  if (iVar12 != 0) goto LAB_005a7ab3;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tinyexr::GetLayers((EXRHeader *)local_1b8,&local_1d8);
  local_438.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_438.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_438.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c8 = local_3b8;
  if (layername == (char *)0x0) {
    pcVar14 = "";
    pcVar26 = "";
  }
  else {
    sVar15 = strlen(layername);
    pcVar14 = layername + sVar15;
    pcVar26 = layername;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,pcVar26,pcVar14);
  pLVar8 = local_438.
           super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>._M_impl
           .super__Vector_impl_data._M_finish;
  pLVar7 = local_438.
           super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (local_438.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_438.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    paVar22 = &((local_438.
                 super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
                 _M_impl.super__Vector_impl_data._M_start)->name).field_2;
    do {
      plVar1 = (long *)(((string *)(paVar22 + -1))->_M_dataplus)._M_p;
      if (paVar22 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar1) {
        operator_delete(plVar1,paVar22->_M_allocated_capacity + 1);
      }
      pLVar23 = (pointer)(paVar22 + 1);
      paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar22 + 0x28);
    } while (pLVar23 != pLVar8);
    local_438.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
    _M_impl.super__Vector_impl_data._M_finish = pLVar7;
  }
  if (0 < local_140) {
    lVar25 = 0;
    psVar20 = (size_type *)0x0;
    do {
      std::__cxx11::string::string
                ((string *)&local_418,local_150->name + lVar25,(allocator *)local_360);
      if (local_3c0 == 0) {
        uVar21 = std::__cxx11::string::rfind((char)(string *)&local_418,0x2e);
        if ((uVar21 == 0xffffffffffffffff) || (local_410 <= uVar21)) goto LAB_005a7d03;
        if (uVar21 == 0) goto LAB_005a7cb1;
      }
      else {
        local_360 = (undefined1  [8])&local_350;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_360,local_3c8,local_3c0 + (long)local_3c8);
        std::__cxx11::string::_M_replace_aux((ulong)local_360,(ulong)local_358._M_p,0,'\x01');
        lVar16 = std::__cxx11::string::find((char *)&local_418,(ulong)local_360,0);
        if (local_360 != (undefined1  [8])&local_350) {
          operator_delete((void *)local_360,local_350 + 1);
        }
        if (lVar16 != -1) {
          if (lVar16 == 0) {
LAB_005a7cb1:
            std::__cxx11::string::substr((ulong)local_360,(ulong)&local_418);
            std::__cxx11::string::operator=((string *)&local_418,(string *)local_360);
            if (local_360 != (undefined1  [8])&local_350) {
              operator_delete((void *)local_360,local_350 + 1);
            }
          }
LAB_005a7d03:
          local_398 = local_388;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_398,local_418,(long)local_418 + local_410);
          local_358._M_p = (pointer)local_348;
          local_360 = (undefined1  [8])psVar20;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_358,local_398,local_390 + (long)local_398);
          if (local_398 != local_388) {
            operator_delete(local_398,local_388[0] + 1);
          }
          std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::push_back
                    (&local_438,(value_type *)local_360);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358._M_p != local_348) {
            operator_delete(local_358._M_p,local_348[0]._M_allocated_capacity + 1);
          }
        }
      }
      if (local_418 != local_408) {
        operator_delete(local_418,local_408[0] + 1);
      }
      psVar20 = (size_type *)((long)psVar20 + 1);
      lVar25 = lVar25 + 0x110;
    } while ((long)psVar20 < (long)local_140);
  }
  if (local_3c8 != local_3b8) {
    operator_delete(local_3c8,local_3b8[0] + 1);
  }
  if ((long)local_438.
            super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_438.
            super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
            _M_impl.super__Vector_impl_data._M_start == 0) {
    if (layername == (char *)0x0) {
      pcVar26 = 
      "Layer Not Found. Seems EXR contains channels with layer(e.g. `diffuse.R`). if you are using LoadEXR(), please try LoadEXRWithLayer(). LoadEXR() cannot load EXR having channels with layer."
      ;
      pcVar14 = "";
    }
    else {
      pcVar26 = "Layer Not Found";
      pcVar14 = "";
    }
    local_360 = (undefined1  [8])&local_350;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_360,pcVar26,pcVar14);
    auVar10 = local_360;
    if (err != (char **)0x0) {
      pcVar14 = strdup((char *)local_360);
      *err = pcVar14;
    }
    if (auVar10 != (undefined1  [8])&local_350) {
      operator_delete((void *)auVar10,local_350 + 1);
    }
    iVar12 = -0xd;
    goto LAB_005a83da;
  }
  uVar18 = ((long)local_438.
                  super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_438.
                  super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  uVar21 = 4;
  if (uVar18 < 4) {
    uVar21 = uVar18;
  }
  local_480 = -1;
  lVar25 = 0;
  local_440 = -1;
  local_448 = -1;
  local_458 = -1;
  do {
    pcVar14 = (char *)((long)&((local_438.
                                super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>
                                ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                      lVar25);
    piVar32 = (int *)((long)&(local_438.
                              super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>
                              ._M_impl.super__Vector_impl_data._M_start)->index + lVar25);
    iVar12 = std::__cxx11::string::compare(pcVar14);
    if (iVar12 == 0) {
      local_480 = *piVar32;
    }
    else {
      iVar12 = std::__cxx11::string::compare(pcVar14);
      if (iVar12 == 0) {
        local_440 = *piVar32;
      }
      else {
        iVar12 = std::__cxx11::string::compare(pcVar14);
        if (iVar12 == 0) {
          local_448 = *piVar32;
        }
        else {
          iVar12 = std::__cxx11::string::compare(pcVar14);
          if (iVar12 == 0) {
            local_458 = *piVar32;
          }
        }
      }
    }
    lVar25 = lVar25 + 0x28;
  } while ((uVar21 + (uVar21 == 0)) * 0x28 != lVar25);
  iVar12 = local_3f8.width;
  iVar9 = local_3f8.height;
  if ((long)local_438.
            super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_438.
            super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
            _M_impl.super__Vector_impl_data._M_start == 0x28) {
    sVar2 = (local_438.
             super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
             _M_impl.super__Vector_impl_data._M_start)->index;
    uVar21 = (ulong)local_3f8.width;
    uVar18 = (ulong)local_3f8.height;
    lVar25 = uVar21 * uVar18;
    pfVar17 = (float *)malloc(lVar25 * 0x10);
    *out_rgba = pfVar17;
    iVar30 = (int)sVar2;
    if (local_180 == 0) {
      if (lVar25 != 0) {
        puVar3 = local_3f8.images[iVar30];
        lVar16 = 0;
        do {
          fVar34 = *(float *)(puVar3 + lVar16 * 4);
          *pfVar17 = fVar34;
          pfVar17[1] = fVar34;
          pfVar17[2] = fVar34;
          pfVar17[3] = fVar34;
          lVar16 = lVar16 + 1;
          pfVar17 = pfVar17 + 4;
        } while (lVar25 - lVar16 != 0);
      }
    }
    else if (0 < (long)local_3f8.num_tiles) {
      lVar25 = (long)local_17c;
      local_460 = 0;
      do {
        if (local_178 != 0) {
          pEVar28 = local_3f8.tiles + local_460;
          lVar16 = 0;
          lVar29 = 0;
          do {
            if (local_17c != 0) {
              uVar31 = pEVar28->offset_x * lVar25;
              uVar24 = (long)pEVar28->offset_y * (long)local_178 + lVar29;
              pfVar33 = pfVar17 + (uVar21 * uVar24 + uVar31) * 4 + 3;
              lVar19 = lVar25;
              lVar27 = lVar16;
              do {
                if ((uVar31 < uVar21) && (uVar24 < uVar18)) {
                  puVar3 = pEVar28->images[iVar30];
                  fVar34 = *(float *)(puVar3 + lVar27);
                  pfVar33[-3] = fVar34;
                  pfVar33[-2] = fVar34;
                  fVar34 = *(float *)(puVar3 + lVar27);
                  pfVar33[-1] = fVar34;
                  *pfVar33 = fVar34;
                }
                pfVar33 = pfVar33 + 4;
                uVar31 = uVar31 + 1;
                lVar27 = lVar27 + 4;
                lVar19 = lVar19 + -1;
              } while (lVar19 != 0);
            }
            lVar29 = lVar29 + 1;
            lVar16 = lVar16 + lVar25 * 4;
          } while (lVar29 != local_178);
        }
        local_460 = local_460 + 1;
      } while (local_460 != local_3f8.num_tiles);
    }
LAB_005a835a:
    *width = iVar12;
    *height = iVar9;
    iVar12 = 0;
  }
  else {
    if (local_480 == -1) {
      pcVar26 = "R channel not found";
      pcVar14 = "";
    }
    else if (local_440 == -1) {
      pcVar26 = "G channel not found";
      pcVar14 = "";
    }
    else {
      if (local_448 != -1) {
        uVar18 = (ulong)local_3f8.width;
        uVar21 = (ulong)local_3f8.height;
        lVar25 = uVar18 * uVar21;
        pfVar17 = (float *)malloc(lVar25 * 0x10);
        *out_rgba = pfVar17;
        if (local_180 == 0) {
          if (lVar25 != 0) {
            puVar3 = local_3f8.images[local_480];
            puVar5 = local_3f8.images[local_440];
            puVar6 = local_3f8.images[local_448];
            pfVar17 = pfVar17 + 3;
            lVar16 = 0;
            do {
              pfVar17[-3] = *(float *)(puVar3 + lVar16 * 4);
              pfVar17[-2] = *(float *)(puVar5 + lVar16 * 4);
              pfVar17[-1] = *(float *)(puVar6 + lVar16 * 4);
              fVar34 = 1.0;
              if (local_458 != -1) {
                fVar34 = *(float *)(local_3f8.images[local_458] + lVar16 * 4);
              }
              *pfVar17 = fVar34;
              lVar16 = lVar16 + 1;
              pfVar17 = pfVar17 + 4;
            } while (lVar25 - lVar16 != 0);
          }
        }
        else {
          local_3a0 = (long)local_3f8.num_tiles;
          if (0 < local_3a0) {
            lVar25 = (long)local_17c;
            local_3a8 = local_3f8.tiles;
            local_420 = 0;
            do {
              if (local_178 != 0) {
                pEVar28 = local_3f8.tiles + local_420;
                lVar29 = 0;
                lVar16 = 0;
                do {
                  if (local_17c != 0) {
                    uVar24 = pEVar28->offset_x * lVar25;
                    uVar31 = (long)pEVar28->offset_y * (long)local_178 + lVar16;
                    pfVar33 = pfVar17 + (uVar18 * uVar31 + uVar24) * 4 + 3;
                    lVar19 = lVar25;
                    lVar27 = lVar29;
                    do {
                      if ((uVar24 < uVar18) && (uVar31 < uVar21)) {
                        ppuVar4 = pEVar28->images;
                        pfVar33[-3] = *(float *)(ppuVar4[local_480] + lVar27);
                        pfVar33[-2] = *(float *)(ppuVar4[local_440] + lVar27);
                        pfVar33[-1] = *(float *)(ppuVar4[local_448] + lVar27);
                        fVar34 = 1.0;
                        if (local_458 != -1) {
                          fVar34 = *(float *)(ppuVar4[local_458] + lVar27);
                        }
                        *pfVar33 = fVar34;
                      }
                      lVar27 = lVar27 + 4;
                      pfVar33 = pfVar33 + 4;
                      uVar24 = uVar24 + 1;
                      lVar19 = lVar19 + -1;
                    } while (lVar19 != 0);
                  }
                  lVar16 = lVar16 + 1;
                  lVar29 = lVar29 + lVar25 * 4;
                } while (lVar16 != local_178);
              }
              local_420 = local_420 + 1;
            } while (local_420 != local_3a0);
          }
        }
        goto LAB_005a835a;
      }
      pcVar26 = "B channel not found";
      pcVar14 = "";
    }
    local_360 = (undefined1  [8])&local_350;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_360,pcVar26,pcVar14);
    auVar10 = local_360;
    if (err != (char **)0x0) {
      pcVar14 = strdup((char *)local_360);
      *err = pcVar14;
    }
    if (auVar10 != (undefined1  [8])&local_350) {
      operator_delete((void *)auVar10,local_350 + 1);
    }
    iVar12 = -4;
  }
LAB_005a83da:
  FreeEXRHeader((EXRHeader *)local_1b8);
  FreeEXRImage(&local_3f8);
  std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::~vector(&local_438);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d8);
  return iVar12;
}

Assistant:

int LoadEXRWithLayer(float **out_rgba, int *width, int *height,
                     const char *filename, const char *layername,
                     const char **err) {
  if (out_rgba == NULL) {
    tinyexr::SetErrorMessage("Invalid argument for LoadEXR()", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  EXRVersion exr_version;
  EXRImage exr_image;
  EXRHeader exr_header;
  InitEXRHeader(&exr_header);
  InitEXRImage(&exr_image);

  {
    int ret = ParseEXRVersionFromFile(&exr_version, filename);
    if (ret != TINYEXR_SUCCESS) {
      std::stringstream ss;
      ss << "Failed to open EXR file or read version info from EXR file. code("
         << ret << ")";
      tinyexr::SetErrorMessage(ss.str(), err);
      return ret;
    }

    if (exr_version.multipart || exr_version.non_image) {
      tinyexr::SetErrorMessage(
          "Loading multipart or DeepImage is not supported  in LoadEXR() API",
          err);
      return TINYEXR_ERROR_INVALID_DATA;  // @fixme.
    }
  }

  {
    int ret = ParseEXRHeaderFromFile(&exr_header, &exr_version, filename, err);
    if (ret != TINYEXR_SUCCESS) {
      FreeEXRHeader(&exr_header);
      return ret;
    }
  }

  // Read HALF channel as FLOAT.
  for (int i = 0; i < exr_header.num_channels; i++) {
    if (exr_header.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
      exr_header.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }
  }

  // TODO: Probably limit loading to layers (channels) selected by layer index
  {
    int ret = LoadEXRImageFromFile(&exr_image, &exr_header, filename, err);
    if (ret != TINYEXR_SUCCESS) {
      FreeEXRHeader(&exr_header);
      return ret;
    }
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;

  std::vector<std::string> layer_names;
  tinyexr::GetLayers(exr_header, layer_names);

  std::vector<tinyexr::LayerChannel> channels;
  tinyexr::ChannelsInLayer(
      exr_header, layername == NULL ? "" : std::string(layername), channels);


  if (channels.size() < 1) {
    if (layername == NULL) {
      tinyexr::SetErrorMessage("Layer Not Found. Seems EXR contains channels with layer(e.g. `diffuse.R`). if you are using LoadEXR(), please try LoadEXRWithLayer(). LoadEXR() cannot load EXR having channels with layer.", err);

    } else {
      tinyexr::SetErrorMessage("Layer Not Found", err);
    }
    FreeEXRHeader(&exr_header);
    FreeEXRImage(&exr_image);
    return TINYEXR_ERROR_LAYER_NOT_FOUND;
  }

  size_t ch_count = channels.size() < 4 ? channels.size() : 4;
  for (size_t c = 0; c < ch_count; c++) {
    const tinyexr::LayerChannel &ch = channels[c];

    if (ch.name == "R") {
      idxR = int(ch.index);
    } else if (ch.name == "G") {
      idxG = int(ch.index);
    } else if (ch.name == "B") {
      idxB = int(ch.index);
    } else if (ch.name == "A") {
      idxA = int(ch.index);
    }
  }

  if (channels.size() == 1) {
    int chIdx = int(channels.front().index);
    // Grayscale channel only.

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));

    if (exr_header.tiled) {
      const size_t tile_size_x = static_cast<size_t>(exr_header.tile_size_x);
      const size_t tile_size_y = static_cast<size_t>(exr_header.tile_size_y);
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (size_t j = 0; j < tile_size_y; j++) {
          for (size_t i = 0; i < tile_size_x; i++) {
            const size_t ii =
              static_cast<size_t>(exr_image.tiles[it].offset_x) * tile_size_x +
              i;
            const size_t jj =
              static_cast<size_t>(exr_image.tiles[it].offset_y) * tile_size_y +
              j;
            const size_t idx = ii + jj * static_cast<size_t>(exr_image.width);

            // out of region check.
            if (ii >= static_cast<size_t>(exr_image.width)) {
              continue;
            }
            if (jj >= static_cast<size_t>(exr_image.height)) {
              continue;
            }
            const size_t srcIdx = i + j * tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
            (*out_rgba)[4 * idx + 3] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
          }
        }
      }
    } else {
      const size_t pixel_size = static_cast<size_t>(exr_image.width) *
        static_cast<size_t>(exr_image.height);
      for (size_t i = 0; i < pixel_size; i++) {
        const float val =
            reinterpret_cast<float **>(exr_image.images)[chIdx][i];
        (*out_rgba)[4 * i + 0] = val;
        (*out_rgba)[4 * i + 1] = val;
        (*out_rgba)[4 * i + 2] = val;
        (*out_rgba)[4 * i + 3] = val;
      }
    }
  } else {
    // Assume RGB(A)

    if (idxR == -1) {
      tinyexr::SetErrorMessage("R channel not found", err);

      FreeEXRHeader(&exr_header);
      FreeEXRImage(&exr_image);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxG == -1) {
      tinyexr::SetErrorMessage("G channel not found", err);
      FreeEXRHeader(&exr_header);
      FreeEXRImage(&exr_image);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxB == -1) {
      tinyexr::SetErrorMessage("B channel not found", err);
      FreeEXRHeader(&exr_header);
      FreeEXRImage(&exr_image);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));
    if (exr_header.tiled) {
      const size_t tile_size_x = static_cast<size_t>(exr_header.tile_size_x);
      const size_t tile_size_y = static_cast<size_t>(exr_header.tile_size_y);
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (size_t j = 0; j < tile_size_y; j++) {
          for (size_t i = 0; i < tile_size_x; i++) {
            const size_t ii =
                static_cast<size_t>(exr_image.tiles[it].offset_x) *
                    tile_size_x +
                i;
            const size_t jj =
                static_cast<size_t>(exr_image.tiles[it].offset_y) *
                    tile_size_y +
                j;
            const size_t idx = ii + jj * static_cast<size_t>(exr_image.width);

            // out of region check.
            if (ii >= static_cast<size_t>(exr_image.width)) {
              continue;
            }
            if (jj >= static_cast<size_t>(exr_image.height)) {
              continue;
            }
            const size_t srcIdx = i + j * tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[idxR][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[idxG][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[idxB][srcIdx];
            if (idxA != -1) {
              (*out_rgba)[4 * idx + 3] =
                  reinterpret_cast<float **>(src)[idxA][srcIdx];
            } else {
              (*out_rgba)[4 * idx + 3] = 1.0;
            }
          }
        }
      }
    } else {
      const size_t pixel_size = static_cast<size_t>(exr_image.width) *
        static_cast<size_t>(exr_image.height);
      for (size_t i = 0; i < pixel_size; i++) {
        (*out_rgba)[4 * i + 0] =
            reinterpret_cast<float **>(exr_image.images)[idxR][i];
        (*out_rgba)[4 * i + 1] =
            reinterpret_cast<float **>(exr_image.images)[idxG][i];
        (*out_rgba)[4 * i + 2] =
            reinterpret_cast<float **>(exr_image.images)[idxB][i];
        if (idxA != -1) {
          (*out_rgba)[4 * i + 3] =
              reinterpret_cast<float **>(exr_image.images)[idxA][i];
        } else {
          (*out_rgba)[4 * i + 3] = 1.0;
        }
      }
    }
  }

  (*width) = exr_image.width;
  (*height) = exr_image.height;

  FreeEXRHeader(&exr_header);
  FreeEXRImage(&exr_image);

  return TINYEXR_SUCCESS;
}